

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Organya.cpp
# Opt level: O3

BOOL StartOrganya(char *path_wave)

{
  BOOL BVar1;
  
  if ((audio_backend_initialised) && (BVar1 = InitWaveData100(path_wave), BVar1)) {
    OrgData::InitOrgData(&org_data);
    return true;
  }
  return false;
}

Assistant:

BOOL StartOrganya(const char *path_wave)
{
	if (!audio_backend_initialised)
		return FALSE;

	if (!InitWaveData100(path_wave))
		return FALSE;

	org_data.InitOrgData();

	return TRUE;
}